

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O3

int enum_ufs(char *dir,char *name,char *ver,FINFO **finfo_buf)

{
  finfo **ppfVar1;
  int iVar2;
  int *piVar3;
  DIR *__dirp;
  dirent *pdVar4;
  char *pcVar5;
  FINFO *__ptr;
  FPROP *pFVar6;
  size_t sVar7;
  finfo *pfVar8;
  char *__src;
  FINFO *pFVar9;
  char tver [16];
  stat sbuf;
  char pext [255];
  char pname [255];
  char text [255];
  char tname [255];
  char namebuf [4096];
  int local_14fc;
  char local_14d8 [16];
  stat local_14c8;
  char local_1438 [256];
  char local_1338 [256];
  char local_1238 [256];
  char local_1138 [256];
  char local_1038 [4104];
  
  piVar3 = __errno_location();
  *piVar3 = 0;
  alarm(TIMEOUT_TIME);
  do {
    *piVar3 = 0;
    __dirp = opendir(dir);
    if (__dirp != (DIR *)0x0) {
      alarm(0);
      alarm(TIMEOUT_TIME);
      pdVar4 = readdir(__dirp);
      alarm(0);
      pFVar9 = (FINFO *)0x0;
      local_14fc = 0;
      goto LAB_00117fcb;
    }
  } while (*piVar3 == 4);
  alarm(0);
  goto LAB_00117f6f;
LAB_00117fcb:
  if (pdVar4 == (dirent *)0x0) {
    if (*piVar3 != 4) {
      closedir(__dirp);
      if (local_14fc < 1) {
        return local_14fc;
      }
      *finfo_buf = pFVar9;
      return local_14fc;
    }
    goto LAB_0011827e;
  }
  if (((pdVar4->d_name[0] == '.') &&
      ((pdVar4->d_name[1] == '\0' || ((pdVar4->d_name[1] == '.' && (pdVar4->d_name[2] == '\0'))))))
     || (pdVar4->d_ino == 0)) goto LAB_0011827e;
  __src = pdVar4->d_name;
  strcpy(local_1138,__src);
  strcpy(local_1338,name);
  separate_version(local_1138,local_14d8,0);
  pcVar5 = strrchr(local_1138,0x2e);
  if (pcVar5 == (char *)0x0) {
    local_1238[0] = '\0';
  }
  else {
    *pcVar5 = '\0';
    strcpy(local_1238,pcVar5 + 1);
  }
  pcVar5 = strrchr(local_1338,0x2e);
  if (pcVar5 == (char *)0x0) {
    local_1438[0] = '\0';
  }
  else {
    *pcVar5 = '\0';
    strcpy(local_1438,pcVar5 + 1);
  }
  iVar2 = match_pattern(local_1138,local_1338);
  if (((iVar2 == 0) || (iVar2 = match_pattern(local_1238,local_1438), iVar2 == 0)) ||
     (iVar2 = match_pattern(local_14d8,ver), iVar2 == 0)) goto LAB_0011827e;
  if (FreeFinfoList == (FINFO *)0x0) {
    __ptr = (FINFO *)calloc(1,0x228);
    pfVar8 = pFVar9;
    if (__ptr == (FINFO *)0x0) goto LAB_00118309;
    pFVar6 = (FPROP *)calloc(1,0x118);
    __ptr->prop = pFVar6;
    if (pFVar6 == (FPROP *)0x0) {
      free(__ptr);
LAB_00118309:
      do {
        ppfVar1 = &pfVar8->next;
        pfVar8 = *ppfVar1;
        FreeFinfoList = pFVar9;
      } while (*ppfVar1 != (finfo *)0x0);
      goto LAB_0011831c;
    }
  }
  else {
    __ptr = FreeFinfoList;
    FreeFinfoList = FreeFinfoList->next;
  }
  __ptr->next = pFVar9;
  sprintf(local_1038,"%s/%s",dir,__src);
  alarm(TIMEOUT_TIME);
  do {
    *piVar3 = 0;
    iVar2 = stat(local_1038,&local_14c8);
    if (iVar2 != -1) {
      alarm(0);
      goto LAB_001181c2;
    }
  } while (*piVar3 == 4);
  alarm(0);
  pfVar8 = __ptr;
  if (*piVar3 != 2) goto LAB_001182d8;
LAB_001181c2:
  strcpy(local_1038,__src);
  if ((local_14c8.st_mode & 0xf000) == 0x4000) {
    __ptr->dirp = 1;
    quote_dname(local_1038);
    strcpy(__ptr->lname,local_1038);
    sVar7 = strlen(local_1038);
    (__ptr->lname + sVar7)[0] = '>';
    (__ptr->lname + sVar7)[1] = '\0';
    sVar7 = sVar7 + 1;
  }
  else {
    __ptr->dirp = 0;
    quote_fname_ufs(local_1038);
    sVar7 = strlen(local_1038);
    strcpy(__ptr->lname,local_1038);
    __ptr->lname[sVar7] = '\0';
  }
  __ptr->lname_len = sVar7;
  strcpy(local_1038,__src);
  __ptr->ino = local_14c8.st_ino;
  local_14fc = local_14fc + 1;
  pFVar9 = __ptr;
LAB_0011827e:
  *piVar3 = 0;
  alarm(TIMEOUT_TIME);
  pdVar4 = readdir(__dirp);
  alarm(0);
  goto LAB_00117fcb;
LAB_001182d8:
  do {
    pFVar9 = pfVar8;
    pfVar8 = pFVar9->next;
  } while (pfVar8 != (finfo *)0x0);
  pFVar9->next = FreeFinfoList;
  FreeFinfoList = __ptr;
LAB_0011831c:
  closedir(__dirp);
LAB_00117f6f:
  *Lisp_errno = *piVar3;
  return -1;
}

Assistant:

static int enum_ufs(char *dir, char *name, char *ver, FINFO **finfo_buf)
{
  struct dirent *dp;
  FINFO *prevp;
  FINFO *nextp;
  int n, rval;
  size_t len;
  DIR *dirp;
  struct stat sbuf;
  char namebuf[MAXPATHLEN];

  errno = 0;
  TIMEOUT0(dirp = opendir(dir));
  if (dirp == NULL) {
    *Lisp_errno = errno;
    return (-1);
  }

  for (S_TOUT(dp = readdir(dirp)), nextp = prevp = (FINFO *)NULL, n = 0;
       dp != (struct dirent *)NULL || errno == EINTR;
       errno = 0, S_TOUT(dp = readdir(dirp)), prevp = nextp)
    if (dp) {
      if (strcmp(dp->d_name, ".") == 0 || strcmp(dp->d_name, "..") == 0 || dp->d_ino == 0) continue;
      MatchP_Case((char *)dp->d_name, name, ver, match, unmatch);
    unmatch:
      continue;
    match:
      AllocFinfo(nextp);
      if (nextp == (FINFO *)NULL) {
        FreeFinfo(prevp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }
      nextp->next = prevp;
      sprintf(namebuf, "%s/%s", dir, dp->d_name);
      TIMEOUT(rval = stat(namebuf, &sbuf));
      if (rval == -1 && errno != ENOENT) {
        /*
         * ENOENT error might be caused by missing symbolic
         * link. We should ignore such error here.
         */
        FreeFinfo(nextp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }

      strcpy(namebuf, dp->d_name);
      if (S_ISDIR(sbuf.st_mode)) {
        nextp->dirp = 1;
        quote_dname(namebuf);
        strcpy(nextp->lname, namebuf);
        len = strlen(namebuf);
        *(nextp->lname + len) = DIRCHAR;
        *(nextp->lname + len + 1) = '\0';
        nextp->lname_len = len + 1;
      } else {
        /* All other types than directory. */
        nextp->dirp = 0;
        quote_fname_ufs(namebuf);
        len = strlen(namebuf);
        strcpy(nextp->lname, namebuf);
        *(nextp->lname + len) = '\0';
        nextp->lname_len = len;
      }

      strcpy(namebuf, dp->d_name);
      len = strlen(namebuf);
      nextp->ino = sbuf.st_ino;
      n++;
    }
  closedir(dirp);
  if (n > 0) *finfo_buf = prevp;
  return (n);
}